

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::getSyncPointListString
          (CLIntercept *this,cl_uint numSyncPoints,cl_sync_point_khr *syncPointList,string *str)

{
  cl_uint i;
  ulong uVar1;
  ostringstream ss;
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"( size = ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," )[ ",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)str,(ulong)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (numSyncPoints != 0 && syncPointList != (cl_sync_point_khr *)0x0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)str);
      }
      snprintf((char *)local_1a8,0x100,"%u",(ulong)syncPointList[uVar1]);
      std::__cxx11::string::append((char *)str);
      uVar1 = uVar1 + 1;
    } while (numSyncPoints != uVar1);
  }
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

void CLIntercept::getSyncPointListString(
    cl_uint numSyncPoints,
    const cl_sync_point_khr* syncPointList,
    std::string& str ) const
{
    {
        std::ostringstream  ss;
        ss << "( size = ";
        ss << numSyncPoints;
        ss << " )[ ";
        str += ss.str();
    }
    if( syncPointList )
    {
        for( cl_uint i = 0; i < numSyncPoints; i++ )
        {
            if( i > 0 )
            {
                str += ", ";
            }
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "%u", syncPointList[i] );
                str += s;
            }
        }
    }
    str += " ]";
}